

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed_forward.h
# Opt level: O1

void __thiscall
shift_window_transformer::FeedForward<float>::forward
          (FeedForward<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  float *pfVar1;
  float *pfVar2;
  double dVar3;
  Tensor<float> tmp2;
  Tensor<float> tmp1;
  float local_a4;
  double local_a0;
  vector<float,_std::allocator<float>_> local_98;
  void *pvStack_80;
  undefined8 local_78;
  long lStack_70;
  float *local_68;
  float *pfStack_60;
  long local_58;
  void *pvStack_50;
  undefined8 local_48;
  long lStack_40;
  
  local_48 = 0;
  lStack_40 = 0;
  local_58 = 0;
  pvStack_50 = (void *)0x0;
  local_68 = (float *)0x0;
  pfStack_60 = (float *)0x0;
  (**(this->linear1->super_Layer<float>)._vptr_Layer)();
  local_78 = 0;
  lStack_70 = 0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  pvStack_80 = (void *)0x0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)&pvStack_80,0,pvStack_50,local_48);
  pfVar1 = pfStack_60;
  if (local_68 != pfStack_60) {
    pfVar2 = local_68;
    do {
      dVar3 = (double)*pfVar2;
      local_a0 = dVar3 * 0.5;
      dVar3 = tanh((dVar3 * 0.044715 * dVar3 * dVar3 + dVar3) * 0.7978845608028654);
      local_a4 = (float)((dVar3 + 1.0) * local_a0);
      if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_98,
                   (iterator)
                   local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_a4);
      }
      else {
        *local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_a4;
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      pfVar2 = pfVar2 + 1;
    } while (pfVar2 != pfVar1);
  }
  (**(this->linear2->super_Layer<float>)._vptr_Layer)(this->linear2,&local_98,output);
  if (pvStack_80 != (void *)0x0) {
    operator_delete(pvStack_80,lStack_70 - (long)pvStack_80);
  }
  if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pvStack_50 != (void *)0x0) {
    operator_delete(pvStack_50,lStack_40 - (long)pvStack_50);
  }
  if (local_68 != (float *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  return;
}

Assistant:

void forward(const Tensor <T> &input, Tensor <T> &output) {
            Tensor<T> tmp1{};
            linear1->forward(input, tmp1);
            Tensor<T> tmp2{};
            tmp2.shape.insert(tmp2.shape.end(), tmp1.shape.begin(), tmp1.shape.end());
            for (auto item: tmp1) {
                tmp2.push_back(GELU(item));
            }
            linear2->forward(tmp2, output);
        }